

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wirehair.cpp
# Opt level: O3

WirehairCodec
wirehair_encoder_create
          (WirehairCodec reuseOpt,void *message,uint64_t messageBytes,uint32_t blockBytes)

{
  WirehairResult WVar1;
  Codec *this;
  
  this = (Codec *)0x0;
  if ((((blockBytes != 0) && (messageBytes != 0)) && (message != (void *)0x0)) &&
     (this = (Codec *)0x0, (m_init & 1) != 0)) {
    this = (Codec *)reuseOpt;
    if (reuseOpt == (WirehairCodec)0x0) {
      this = (Codec *)operator_new(0x100,(nothrow_t *)&std::nothrow);
      if (this == (Codec *)0x0) {
        this = (Codec *)0x0;
      }
      else {
        wirehair::Codec::Codec(this);
      }
    }
    WVar1 = wirehair::Codec::InitializeEncoder(this,messageBytes,blockBytes);
    if ((WVar1 != Wirehair_Success) ||
       (WVar1 = wirehair::Codec::EncodeFeed(this,message), WVar1 != Wirehair_Success)) {
      wirehair::Codec::~Codec(this);
      operator_delete(this);
      this = (Codec *)0x0;
    }
  }
  return (WirehairCodec)this;
}

Assistant:

WIREHAIR_EXPORT WirehairCodec wirehair_encoder_create(
    WirehairCodec reuseOpt, ///< [Optional] Pointer to prior codec object
    const void*    message, ///< Pointer to message
    uint64_t  messageBytes, ///< Bytes in the message
    uint32_t    blockBytes  ///< Bytes in an output block
)
{
    // If input is invalid:
    if (!m_init || !message || messageBytes < 1 || blockBytes < 1) {
        return nullptr;
    }

    wirehair::Codec* codec = reinterpret_cast<wirehair::Codec*>(reuseOpt);

    // Allocate a new Codec object
    if (!codec) {
        codec = new (std::nothrow) wirehair::Codec;
    }

    // Initialize codec
    WirehairResult result = codec->InitializeEncoder(messageBytes, blockBytes);

    // If initialization succeeded:
    if (result == Wirehair_Success) {
        // Feed message to codec
        result = codec->EncodeFeed(message);
    }

    // If either function failed:
    if (result != Wirehair_Success)
    {
        // Note this will also release the reuse parameter
        delete codec;
        codec = nullptr;
    }

    return reinterpret_cast<WirehairCodec>(codec);
}